

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitMemoryCopy(OptimizeInstructions *this,MemoryCopy *curr)

{
  bool bVar1;
  Expression *rep;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id != 1) {
    bVar1 = FeatureSet::hasBulkMemoryOpt
                      (&((this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .currModule)->features);
    if (!bVar1) {
      __assert_fail("getModule()->features.hasBulkMemoryOpt()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x51a,"void wasm::OptimizeInstructions::visitMemoryCopy(MemoryCopy *)");
    }
    rep = optimizeMemoryCopy(this,curr);
    if (rep != (Expression *)0x0) {
      replaceCurrent(this,rep);
      return;
    }
  }
  return;
}

Assistant:

void visitMemoryCopy(MemoryCopy* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    assert(getModule()->features.hasBulkMemoryOpt());
    if (auto* ret = optimizeMemoryCopy(curr)) {
      return replaceCurrent(ret);
    }
  }